

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O2

void __thiscall pg::SPMSolver::run(SPMSolver *this)

{
  Game *pGVar1;
  bitset *pbVar2;
  pointer piVar3;
  bool bVar4;
  int n;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  ostream *poVar14;
  Error *this_00;
  int i;
  ulong uVar15;
  uint uVar16;
  int *curedge;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  int n_2;
  long lVar20;
  uint *puVar21;
  pointer piVar22;
  int n_3;
  void *local_f0;
  uint local_e8;
  uint local_e4;
  ulong local_e0;
  int *local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  vector<int,_std::allocator<int>_> cycles;
  long local_98;
  queue<int,_std::deque<int,_std::allocator<int>_>_> cm_queue;
  
  pGVar1 = (this->super_Solver).game;
  uVar15 = pGVar1->n_vertices;
  local_d8 = pGVar1->_priority;
  uVar7 = *(uint *)((long)local_d8 + ((long)((uVar15 << 0x20) + -0x100000000) >> 0x1e));
  local_c0 = (ulong)uVar7;
  uVar16 = 2;
  if (0 < (int)uVar7) {
    uVar16 = uVar7 + 1;
  }
  lVar20 = (long)(int)uVar16;
  local_d0 = uVar15 * lVar20;
  this->k = lVar20;
  local_e4 = uVar16;
  piVar9 = (int *)operator_new__(-(ulong)(local_d0 >> 0x3e != 0) | local_d0 * 4);
  this->pms = piVar9;
  uVar19 = -(ulong)(uVar15 >> 0x3e != 0) | uVar15 * 4;
  local_c8 = uVar15;
  piVar10 = (int *)operator_new__(uVar19);
  this->strategy = piVar10;
  uVar15 = 0xffffffffffffffff;
  if (-1 < (int)uVar16) {
    uVar15 = lVar20 * 4;
  }
  piVar11 = (int *)operator_new__(uVar15);
  this->counts = piVar11;
  piVar12 = (int *)operator_new__(uVar15);
  this->tmp = piVar12;
  piVar12 = (int *)operator_new__(uVar15);
  this->best = piVar12;
  piVar12 = (int *)operator_new__(uVar19);
  this->dirty = piVar12;
  local_f0 = (void *)uVar19;
  piVar13 = (int *)operator_new__(uVar19);
  this->unstable = piVar13;
  for (uVar15 = 0; (~((long)local_d0 >> 0x3f) & local_d0) != uVar15; uVar15 = uVar15 + 1) {
    piVar9[uVar15] = 0;
  }
  uVar19 = ~((long)local_c8 >> 0x3f) & local_c8;
  for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
    piVar10[uVar15] = -1;
  }
  for (uVar15 = 0; (~((int)local_e4 >> 0x1f) & local_e4) != uVar15; uVar15 = uVar15 + 1) {
    piVar11[uVar15] = 0;
  }
  pbVar2 = (this->super_Solver).disabled;
  for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
    if ((pbVar2->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
      piVar11[local_d8[uVar15]] = piVar11[local_d8[uVar15]] + 1;
    }
  }
  iVar5 = 1;
  if (1 < (int)local_c0) {
    iVar5 = (int)local_c0;
  }
  local_e0 = (ulong)(iVar5 + 1);
  uVar15 = 0xffffffff;
  do {
    local_e8 = (uint)uVar15;
    do {
      if ((int)local_e0 + -1 < 0) {
        local_e0 = 0xffffffffffffffff;
        goto LAB_0015c503;
      }
      local_e0 = local_e0 - 1;
    } while (piVar11[(uint)local_e0 & 0x7fffffff] == 0);
    if (local_e8 == 0xffffffff) {
      uVar15 = local_e0 & 0xffffffff;
    }
  } while ((local_e0 & 1) != 0);
LAB_0015c503:
  for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
    piVar12[uVar15] = 0;
  }
  local_f0 = operator_new__((ulong)local_f0);
  for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
    *(undefined4 *)((long)local_f0 + uVar15 * 4) = 0;
  }
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>(&cm_queue);
  cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  this->lift_attempt = 0;
  this->lift_count = 0;
  uVar15 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
  while( true ) {
    uVar15 = uVar15 - 1;
    uVar7 = (uint)uVar15;
    if ((int)uVar7 < 0) break;
    if (((((this->super_Solver).disabled)->_bits[(uVar7 & 0x7fffffff) >> 6] >> (uVar15 & 0x3f) & 1)
         == 0) && (bVar4 = lift(this,uVar7,-1), bVar4)) {
      pGVar1 = (this->super_Solver).game;
      piVar9 = pGVar1->_inedges + pGVar1->_firstins[uVar7 & 0x7fffffff];
      while( true ) {
        iVar5 = *piVar9;
        uVar19 = (ulong)iVar5;
        if (uVar19 == 0xffffffffffffffff) break;
        if (((((this->super_Solver).disabled)->_bits[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) &&
           (bVar4 = lift(this,iVar5,uVar7), bVar4)) {
          todo_push(this,iVar5);
        }
        piVar9 = piVar9 + 1;
      }
    }
  }
  local_98 = 0;
  do {
    while ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur !=
           (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur) {
      iVar5 = todo_pop(this);
      pGVar1 = (this->super_Solver).game;
      piVar9 = pGVar1->_inedges + pGVar1->_firstins[iVar5];
      while( true ) {
        iVar8 = *piVar9;
        uVar15 = (ulong)iVar8;
        if (uVar15 == 0xffffffffffffffff) break;
        if (((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) &&
           (bVar4 = lift(this,iVar8,iVar5), bVar4)) {
          todo_push(this,iVar8);
        }
        piVar9 = piVar9 + 1;
      }
      lVar20 = this->lift_count;
      if (((this->super_Solver).game)->n_vertices * 10 + local_98 < lVar20) {
        update(this,0);
        update(this,1);
        local_98 = lVar20;
      }
    }
    if (1 < (this->super_Solver).trace) {
      for (uVar15 = 0; (long)uVar15 < ((this->super_Solver).game)->n_vertices; uVar15 = uVar15 + 1)
      {
        if ((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
          poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[35m**\x1b[m \x1b[1mnode ");
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)uVar15);
          poVar14 = std::operator<<(poVar14,"/");
          poVar14 = (ostream *)
                    std::ostream::operator<<(poVar14,((this->super_Solver).game)->_priority[uVar15])
          ;
          iVar5 = Solver::owner(&this->super_Solver,(int)uVar15);
          pcVar17 = " (odd)";
          if (iVar5 == 0) {
            pcVar17 = " (even)";
          }
          poVar14 = std::operator<<(poVar14,pcVar17);
          std::operator<<(poVar14,"\x1b[m is");
          pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar15);
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
      }
    }
    for (piVar9 = (int *)0x0; piVar9 != (int *)0x2; piVar9 = (int *)((long)piVar9 + 1)) {
      uVar15 = this->k;
      piVar10 = this->best;
      for (uVar19 = 0; (~((long)uVar15 >> 0x3f) & uVar15) != uVar19; uVar19 = uVar19 + 1) {
        piVar10[uVar19] = 0;
      }
      pcVar17 = " odd";
      uVar7 = local_e8;
      if (piVar9 == (int *)0x0) {
        uVar7 = (uint)local_e0;
      }
      local_c8 = CONCAT44(local_c8._4_4_,uVar7);
      if (piVar9 == (int *)0x0) {
        pcVar17 = " even";
      }
      n_3 = 0;
      iVar5 = -1;
      local_e4 = 0xffffffff;
      local_d8 = piVar9;
      while( true ) {
        piVar3 = cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar15 = (ulong)n_3;
        iVar8 = (int)piVar9;
        if (((this->super_Solver).game)->n_vertices <= (long)uVar15) break;
        if ((((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) &&
            (piVar10 = this->pms + uVar15 * this->k, piVar10[(long)piVar9] != -1)) &&
           (iVar6 = pm_cycles(this,piVar10,iVar8), iVar6 != -1)) {
          if (1 < (this->super_Solver).trace) {
            poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[31;1m");
            poVar14 = std::operator<<(poVar14,pcVar17 + 1);
            uVar7 = Solver::owner(&this->super_Solver,n_3);
            pcVar18 = " loser ";
            if (piVar9 == (int *)(ulong)uVar7) {
              pcVar18 = " winner ";
            }
            std::operator<<(poVar14,pcVar18);
            poVar14 = std::operator<<((this->super_Solver).logger,"loops\x1b[m: ");
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,n_3);
            poVar14 = std::operator<<(poVar14,"/");
            poVar14 = (ostream *)
                      std::ostream::operator<<(poVar14,((this->super_Solver).game)->_priority[n_3]);
            poVar14 = std::operator<<(poVar14," (cm = ");
            iVar8 = pm_cycles(this,piVar10,iVar8);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar8);
            std::operator<<(poVar14,")");
            pm_stream(this,(this->super_Solver).logger,piVar10);
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
          if (iVar6 == (int)local_c8) {
            this->pms[(long)((long)n_3 * this->k + (long)piVar9)] = -1;
            todo_push(this,n_3);
            uVar7 = ((this->super_Solver).game)->_priority[n_3];
            if (piVar9 == (int *)(ulong)(uVar7 & 1)) {
              this->counts[(int)uVar7] = this->counts[(int)uVar7] + -1;
            }
            if ((this->super_Solver).trace != 0) {
              poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[1;36mupdated node ");
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,n_3);
              poVar14 = std::operator<<(poVar14,"/");
              poVar14 = (ostream *)
                        std::ostream::operator<<
                                  (poVar14,((this->super_Solver).game)->_priority[n_3]);
              iVar8 = Solver::owner(&this->super_Solver,n_3);
              pcVar18 = " (odd)";
              if (iVar8 == 0) {
                pcVar18 = " (even)";
              }
              poVar14 = std::operator<<(poVar14,pcVar18);
              std::operator<<(poVar14,"\x1b[m to");
              pm_stream(this,(this->super_Solver).logger,this->pms + (long)n_3 * this->k);
              std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
            }
          }
          else {
            std::vector<int,_std::allocator<int>_>::push_back(&cycles,&n_3);
            uVar7 = Solver::owner(&this->super_Solver,n_3);
            if (piVar9 != (int *)(ulong)uVar7) {
              pGVar1 = (this->super_Solver).game;
              local_d0 = CONCAT44(local_d0._4_4_,iVar5);
              puVar21 = (uint *)(pGVar1->_outedges + pGVar1->_firstouts[n_3]);
              local_c0 = CONCAT44(local_c0._4_4_,pGVar1->_priority[n_3]);
              while( true ) {
                uVar7 = *puVar21;
                uVar15 = (ulong)(int)uVar7;
                if (uVar15 == 0xffffffffffffffff) break;
                if (((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) ==
                     0) && ((this->pms + this->k * uVar15)[(long)local_d8] != -1)) {
                  iVar5 = (int)local_d8;
                  Prog(this,this->tmp,this->pms + this->k * uVar15,(int)local_c0,iVar5);
                  lVar20 = this->k;
                  piVar9 = this->tmp;
                  bVar4 = pm_less(this,this->pms + n_3 * lVar20,piVar9,(int)local_c0,iVar5);
                  if ((bVar4) &&
                     ((piVar10 = this->best, piVar11 = local_d8, local_e4 == 0xffffffff ||
                      (bVar4 = pm_less(this,piVar9,piVar10,0,(int)local_d8), piVar11 = local_d8,
                      bVar4)))) {
                    for (; (long)piVar11 < lVar20; piVar11 = (int *)((long)piVar11 + 2)) {
                      piVar10[(long)piVar11] = piVar9[(long)piVar11];
                    }
                    local_d0 = CONCAT44(local_d0._4_4_,n_3);
                    local_e4 = uVar7;
                  }
                }
                puVar21 = puVar21 + 1;
              }
              piVar9 = local_d8;
              iVar5 = (int)local_d0;
            }
          }
        }
        n_3 = n_3 + 1;
      }
      piVar10 = cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start;
      if (local_e4 == 0xffffffff) {
        for (; piVar22 = cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
            piVar10 !=
            cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish; piVar10 = piVar10 + 1) {
          *(undefined4 *)((long)local_f0 + (long)*piVar10 * 4) = 1;
        }
        for (; piVar22 != piVar3; piVar22 = piVar22 + 1) {
          n_3 = *piVar22;
          uVar7 = Solver::owner(&this->super_Solver,n_3);
          pGVar1 = (this->super_Solver).game;
          pbVar2 = (this->super_Solver).disabled;
          piVar10 = pGVar1->_outedges + pGVar1->_firstouts[n_3];
          if (piVar9 == (int *)(ulong)uVar7) {
            for (; uVar15 = (ulong)*piVar10, uVar15 != 0xffffffffffffffff; piVar10 = piVar10 + 1) {
              if (((pbVar2->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) &&
                 (*(int *)((long)local_f0 + uVar15 * 4) != 0)) goto LAB_0015cdd1;
            }
          }
          else {
            for (; uVar15 = (ulong)*piVar10, uVar15 != 0xffffffffffffffff; piVar10 = piVar10 + 1) {
              if ((((pbVar2->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) &&
                  (this->pms[(long)((long)piVar9 + this->k * uVar15)] != -1)) &&
                 (*(int *)((long)local_f0 + uVar15 * 4) == 0)) goto LAB_0015cdb9;
            }
          }
          if (piVar9 == (int *)(ulong)uVar7) {
LAB_0015cdb9:
            *(undefined4 *)((long)local_f0 + (long)n_3 * 4) = 0;
            std::deque<int,_std::allocator<int>_>::push_back(&cm_queue.c,&n_3);
          }
LAB_0015cdd1:
        }
        while (piVar3 = cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,
              piVar10 = cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
              cm_queue.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
              ._M_finish._M_cur !=
              cm_queue.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
              ._M_start._M_cur) {
          iVar5 = *cm_queue.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
          std::deque<int,_std::allocator<int>_>::pop_front(&cm_queue.c);
          pGVar1 = (this->super_Solver).game;
          piVar10 = pGVar1->_inedges + pGVar1->_firstins[iVar5];
          while( true ) {
            iVar5 = *piVar10;
            uVar15 = (ulong)iVar5;
            if (uVar15 == 0xffffffffffffffff) break;
            n_3 = iVar5;
            if (((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0)
               && (*(int *)((long)local_f0 + uVar15 * 4) != 0)) {
              uVar7 = Solver::owner(&this->super_Solver,iVar5);
              if (piVar9 == (int *)(ulong)uVar7) {
                pGVar1 = (this->super_Solver).game;
                for (piVar11 = pGVar1->_outedges + pGVar1->_firstouts[n_3]; uVar15 = (ulong)*piVar11
                    , uVar15 != 0xffffffffffffffff; piVar11 = piVar11 + 1) {
                  if (((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1)
                       == 0) && (*(int *)((long)local_f0 + uVar15 * 4) != 0)) goto LAB_0015ceaa;
                }
              }
              *(undefined4 *)((long)local_f0 + (long)n_3 * 4) = 0;
              std::deque<int,_std::allocator<int>_>::push_back(&cm_queue.c,&n_3);
            }
LAB_0015ceaa:
            piVar10 = piVar10 + 1;
          }
        }
        for (; piVar10 != piVar3; piVar10 = piVar10 + 1) {
          iVar5 = *piVar10;
          lVar20 = (long)iVar5;
          if (*(int *)((long)local_f0 + lVar20 * 4) != 0) {
            *(undefined4 *)((long)local_f0 + lVar20 * 4) = 0;
            this->pms[(long)(this->k * lVar20 + (long)piVar9)] = -1;
            todo_push(this,iVar5);
            uVar7 = ((this->super_Solver).game)->_priority[lVar20];
            if (piVar9 == (int *)(ulong)(uVar7 & 1)) {
              this->counts[(int)uVar7] = this->counts[(int)uVar7] + -1;
            }
            if ((this->super_Solver).trace != 0) {
              poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[1;36mupdated node ");
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar5);
              poVar14 = std::operator<<(poVar14,"/");
              poVar14 = (ostream *)
                        std::ostream::operator<<
                                  (poVar14,((this->super_Solver).game)->_priority[lVar20]);
              iVar5 = Solver::owner(&this->super_Solver,iVar5);
              pcVar18 = " (odd)";
              if (iVar5 == 0) {
                pcVar18 = " (even)";
              }
              poVar14 = std::operator<<(poVar14,pcVar18);
              std::operator<<(poVar14,"\x1b[m to");
              pm_stream(this,(this->super_Solver).logger,this->pms + lVar20 * this->k);
              std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
            }
          }
        }
      }
      else {
        lVar20 = (long)iVar5;
        this->strategy[lVar20] = local_e4;
        pm_copy(this,this->pms + this->k * lVar20,this->best,iVar8);
        todo_push(this,iVar5);
        if ((this->super_Solver).trace != 0) {
          poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[1;36mupdated node ");
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar5);
          poVar14 = std::operator<<(poVar14,"/");
          poVar14 = (ostream *)
                    std::ostream::operator<<(poVar14,((this->super_Solver).game)->_priority[lVar20])
          ;
          iVar5 = Solver::owner(&this->super_Solver,iVar5);
          pcVar18 = " (odd)";
          if (iVar5 == 0) {
            pcVar18 = " (even)";
          }
          poVar14 = std::operator<<(poVar14,pcVar18);
          std::operator<<(poVar14,"\x1b[m to");
          pm_stream(this,(this->super_Solver).logger,this->pms + lVar20 * this->k);
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
      }
      if (cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (this->counts[(int)local_c8] == 0) {
        if (1 < (this->super_Solver).trace) {
          poVar14 = std::operator<<((this->super_Solver).logger,
                                    "\x1b[1mlowering max\x1b[m for player ");
          poVar14 = std::operator<<(poVar14,pcVar17 + 1);
          std::endl<char,std::char_traits<char>>(poVar14);
        }
        if (piVar9 == (int *)0x0) {
          for (; (0 < (int)local_e0 && (this->counts[local_e0 & 0xffffffff] == 0));
              local_e0 = (ulong)((int)local_e0 - 2)) {
          }
        }
        else {
          for (; (0 < (int)local_e8 && (this->counts[local_e8] == 0)); local_e8 = local_e8 - 2) {
          }
        }
      }
    }
    if ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur) {
      if (1 < (this->super_Solver).trace) {
        for (uVar15 = 0; (long)uVar15 < ((this->super_Solver).game)->n_vertices; uVar15 = uVar15 + 1
            ) {
          if ((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
            poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[35m**\x1b[m \x1b[1mnode ");
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)uVar15);
            poVar14 = std::operator<<(poVar14,"/");
            poVar14 = (ostream *)
                      std::ostream::operator<<
                                (poVar14,((this->super_Solver).game)->_priority[uVar15]);
            iVar5 = Solver::owner(&this->super_Solver,(int)uVar15);
            pcVar17 = " (odd)";
            if (iVar5 == 0) {
              pcVar17 = " (even)";
            }
            poVar14 = std::operator<<(poVar14,pcVar17);
            std::operator<<(poVar14,"\x1b[m is");
            pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar15);
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
        }
      }
      uVar15 = 0;
      do {
        if (((this->super_Solver).game)->n_vertices <= (long)uVar15) {
          if (this->pms != (int *)0x0) {
            operator_delete__(this->pms);
          }
          if (this->strategy != (int *)0x0) {
            operator_delete__(this->strategy);
          }
          if (this->counts != (int *)0x0) {
            operator_delete__(this->counts);
          }
          if (this->tmp != (int *)0x0) {
            operator_delete__(this->tmp);
          }
          if (this->best != (int *)0x0) {
            operator_delete__(this->best);
          }
          if (this->dirty != (int *)0x0) {
            operator_delete__(this->dirty);
          }
          operator_delete__(local_f0);
          if (this->unstable != (int *)0x0) {
            operator_delete__(this->unstable);
          }
          poVar14 = std::operator<<((this->super_Solver).logger,"solved with ");
          poVar14 = std::ostream::_M_insert<long>((long)poVar14);
          poVar14 = std::operator<<(poVar14," lifts, ");
          poVar14 = std::ostream::_M_insert<long>((long)poVar14);
          poVar14 = std::operator<<(poVar14," lift attempts.");
          std::endl<char,std::char_traits<char>>(poVar14);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&cycles.super__Vector_base<int,_std::allocator<int>_>);
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                    ((_Deque_base<int,_std::allocator<int>_> *)&cm_queue);
          return;
        }
        if ((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
          lVar20 = this->k * uVar15;
          iVar5 = this->pms[lVar20];
          if ((iVar5 == -1) != (this->pms[lVar20 + 1] != -1)) {
            this_00 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_00,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/spm.cpp"
                         ,0x273);
            __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
          }
          uVar7 = Solver::owner(&this->super_Solver,(int)uVar15);
          iVar8 = -1;
          uVar16 = (uint)(iVar5 != -1);
          if (uVar7 == uVar16) {
            iVar8 = this->strategy[uVar15];
          }
          Solver::solve(&this->super_Solver,(int)uVar15,uVar16,iVar8);
        }
        uVar15 = uVar15 + 1;
      } while( true );
    }
  } while( true );
}

Assistant:

void
SPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;
    if (k < 2) k = 2;

    // now create the data structure, for each node
    pms = new int[(size_t)k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    tmp = new int[k];
    best = new int[k];
    dirty = new int[nodecount()];
    unstable = new int[nodecount()];

    int max0 = -1, max1 = -1;

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (disabled[i] == 0) counts[priority(i)]++;
    for (int i=k-1; i>=0; i--) {
        if (counts[i] == 0) continue;
        if (i&1) { if (max1 == -1) max1 = i; }
        else { if (max0 == -1) max0 = i; }
        if (max0 != -1 and max0 != -1) break;
    }

    // initialize all nodes as not dirty
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // allocate and initialize additional array for cycle measures
    int *cm = new int[nodecount()];
    for (int n=0; n<nodecount(); n++) cm[n] = 0;

    // a queue and a vector for cycle measure analysis
    std::queue<int> cm_queue;
    std::vector<int> cycles;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue to store the dirty vertices.
     */

    /**
     * Initialization loop.
     */

    for (int n=nodecount()-1; n>=0; n--) {
        if (!disabled[n] and lift(n, -1)) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
        }
    }
    
    /**
     * The main loop.
     */

    int64_t last_update = 0;

    while (true) {
        while (!todo.empty()) {
            int n = todo_pop();
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
            if (last_update + 10*nodecount() < lift_count) {
                last_update = lift_count;
                update(0);
                update(1);
            }
        }

#ifndef NDEBUG
        if (trace >= 2) {
            for (int n=0; n<nodecount(); n++) {
                if (disabled[n]) continue;
                logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
                pm_stream(logger, pms + k*n);
                logger << std::endl;
            }
        }
#endif

        /**
         * End of the main loop.
         * When no more lifting occurs, we must analyze nodes with cyclic measures.
         * We analyze for player 0 first, then for player 1.
         */

        for (int pl=0; pl<2; pl++) {
            /**
             * Put all nodes with cycle measures in "cycles"
             * Also find the best (lowest) exit for the loser
             */
            int best_from = -1, best_to = -1;
            for (int i=0; i<k; i++) best[i] = 0;

            int max = pl == 0 ? max0 : max1;

            for (int n=0; n<nodecount(); n++) {
                if (disabled[n]) continue;
                int *pm = pms + k*n;
                if (pm[pl] == -1) continue; // already won
                int c = pm_cycles(pm, pl);
                if (c == -1) continue; // not a cycle measure
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "\033[31;1m" << (pl ? "odd" : "even") << (pl == owner(n) ? " winner " : " loser ");
                    logger << "loops\033[m: " << n << "/" << priority(n) << " (cm = " << pm_cycles(pm, pl) << ")";
                    pm_stream(logger, pm);
                    logger << std::endl;
                }
#endif
                if (c == max) {
                    pms[n*k + pl] = -1;
                    todo_push(n);

                    const int d = priority(n);
                    if ((d&1) == pl) counts[d]--;

                    if (trace) {
                        logger << "\033[1;36mupdated node " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m to";
                        pm_stream(logger, pms + n*k);
                        logger << std::endl;
                    }

                    continue;
                }

                cycles.push_back(n);
                if (owner(n) != pl) {
                    const int d = priority(n);
                    for (auto curedge = outs(n); *curedge != -1; curedge++) {
                        int to = *curedge;
                        if (disabled[to]) continue;
                        int *pm_to = pms + k*to;
                        if (pm_to[pl] == -1) continue; // already won
                        Prog(tmp, pm_to, d, pl);
                        if (!pm_less(pms + k*n, tmp, d, pl)) continue; // candidate must increase measure
                        if (best_to == -1 or pm_less(tmp, best, 0, pl))  {
                            for (int i=pl; i<k; i+=2) best[i] = tmp[i];
                            best_from = n;
                            best_to = to;
                        }
                    }
                }
            }

            if (best_to != -1) {
                /**
                 * OK we found the best exit from <best_from> to <best_to>.
                 */
                strategy[best_from] = best_to;
                pm_copy(pms + best_from*k, best, pl);
                todo_push(best_from);

                if (trace) {
                    logger << "\033[1;36mupdated node " << best_from << "/" << priority(best_from) << (owner(best_from)?" (odd)":" (even)") << "\033[m to";
                    pm_stream(logger, pms + best_from*k);
                    logger << std::endl;
                }

                cycles.clear();
            } else {
                /**
                 * No exit found, everything that remains a cycle after removing escaping nodes is now won.
                 */
                for (int n : cycles) cm[n] = 1; // mark everything in 'cycles'

                for (int n : cycles) {
                    bool escapes;
                    if (owner(n) == pl) {
                        // check if it can stay in cm
                        escapes = true;
                        for (auto curedge = outs(n); *curedge != -1; curedge++) {
                            int m = *curedge;
                            if (disabled[m] == 0 and cm[m]) {
                                escapes = false;
                                break;
                            }
                        }
                    } else {
                        // check if it can move out of cm
                        escapes = false;
                        for (auto curedge = outs(n); *curedge != -1; curedge++) {
                            int m = *curedge;
                            if (disabled[m] == 0 and pms[k*m+pl] != -1 and cm[m] == 0) {
                                escapes = true;
                                break;
                            }
                        }
                    }
                    if (escapes) {
                        cm[n] = 0;
                        cm_queue.push(n);
                    }
                }

                /**
                 * Run backwards search to remove nodes that can escape to non-CM
                 */

                while (!cm_queue.empty()) {
                    int n = cm_queue.front();
                    cm_queue.pop();
                    for (auto curedge = ins(n); *curedge != -1; curedge++) {
                        int m = *curedge;
                        if (disabled[m] != 0 or cm[m] == 0) continue;
                        if (owner(m) == pl) {
                            bool escapes = false;
                            for (auto curedge = outs(m); *curedge != -1; curedge++) {
                                int to = *curedge;
                                if (disabled[to] == 0 and cm[to]) {
                                    escapes = true;
                                    break;
                                }
                            }
                            if (escapes) continue;
                        }
                        cm[m] = 0;
                        cm_queue.push(m);
                    }
                }

                /**
                 * Finally, mark remaining nodes as won
                 */

                for (int n : cycles) {
                    if (cm[n]) {
                        cm[n] = 0;
                        pms[n*k + pl] = -1;
                        todo_push(n);

                        const int d = priority(n);
                        if ((d&1) == pl) counts[d]--;

                        if (trace) {
                            logger << "\033[1;36mupdated node " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m to";
                            pm_stream(logger, pms + n*k);
                            logger << std::endl;
                        }
                    }
                }

                cycles.clear();
            }

            if (counts[max] == 0) {
                if (trace >= 2) logger << "\033[1mlowering max\033[m for player " << (pl == 0 ? "even" : "odd") << std::endl;
                if (pl == 0) { while (max0 > 0 and counts[max0] == 0) max0 -= 2; }
                else { while (max1 > 0 and counts[max1] == 0) max1 -= 2; }
            }
        }

        if (todo.empty()) break;
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int n=0; n<nodecount(); n++) {
            if (disabled[n]) continue;
            logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            logger << std::endl;
        }
    }
#endif

    // Now set dominions and derive strategy for even.
    for (int n=0; n<nodecount(); n++) {
        if (disabled[n]) continue;
        int *pm = pms + k*n;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(n, winner, owner(n) == winner ? strategy[n] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] tmp;
    delete[] best;
    delete[] dirty;
    delete[] cm;
    delete[] unstable;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}